

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

void __thiscall wasm::OptimizeAddedConstants::visitLoad(OptimizeAddedConstants *this,Load *curr)

{
  bool bVar1;
  Module *module;
  pointer localGraph;
  undefined1 local_40 [8];
  MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> optimizer;
  Load *curr_local;
  OptimizeAddedConstants *this_local;
  
  optimizer._32_8_ = curr;
  module = Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
           ::getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                        .
                        super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                      );
  localGraph = std::unique_ptr<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>::
               get(&this->localGraph);
  MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::MemoryAccessOptimizer
            ((MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *)local_40,this,curr,
             module,localGraph);
  bVar1 = MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::optimize
                    ((MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *)local_40);
  if (bVar1) {
    this->propagated = true;
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
    MemoryAccessOptimizer<OptimizeAddedConstants, Load> optimizer(
      this, curr, getModule(), localGraph.get());
    if (optimizer.optimize()) {
      propagated = true;
    }
  }